

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintTwoBodies::MultiplyAndAdd
          (ChConstraintTwoBodies *this,double *result,ChVectorDynamic<double> *vect)

{
  ChVariables *pCVar1;
  double *pdVar2;
  long lVar3;
  
  pCVar1 = (this->super_ChConstraintTwo).variables_a;
  if (pCVar1->disabled == false) {
    lVar3 = (long)pCVar1->offset;
    if ((lVar3 < 0) ||
       ((vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -6
        < lVar3)) goto LAB_007d7a3b;
    pdVar2 = (vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    *result = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[0] * pdVar2[lVar3] +
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[2] * pdVar2[lVar3 + 2] +
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[4] * pdVar2[lVar3 + 4] +
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[1] * (pdVar2 + lVar3)[1] +
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[3] * (pdVar2 + lVar3 + 2)[1] +
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[5] * (pdVar2 + lVar3 + 4)[1] + *result;
  }
  pCVar1 = (this->super_ChConstraintTwo).variables_b;
  if (pCVar1->disabled == false) {
    lVar3 = (long)pCVar1->offset;
    if ((lVar3 < 0) ||
       ((vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -6
        < lVar3)) {
LAB_007d7a3b:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    pdVar2 = (vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    *result = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[0] * pdVar2[lVar3] +
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[2] * pdVar2[lVar3 + 2] +
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[4] * pdVar2[lVar3 + 4] +
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[1] * (pdVar2 + lVar3)[1] +
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[3] * (pdVar2 + lVar3 + 2)[1] +
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[5] * (pdVar2 + lVar3 + 4)[1] + *result;
  }
  return;
}

Assistant:

void ChConstraintTwoBodies::MultiplyAndAdd(double& result, const ChVectorDynamic<double>& vect) const {
    if (variables_a->IsActive()) {
        result += Cq_a * vect.segment(variables_a->GetOffset(), 6);
    }

    if (variables_b->IsActive()) {
        result += Cq_b * vect.segment(variables_b->GetOffset(), 6);
    }
}